

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_stack.h
# Opt level: O0

void uo_stack_push_arr(uo_stack *stack,void **items,size_t count)

{
  ulong n;
  uint64_t uVar1;
  void **ppvVar2;
  size_t stack_count;
  size_t count_local;
  void **items_local;
  uo_stack *stack_local;
  
  n = count + stack->count;
  if (stack->capacity < n) {
    ppvVar2 = stack->items;
    uVar1 = next_power_of_two(n);
    stack->capacity = uVar1;
    ppvVar2 = (void **)realloc(ppvVar2,uVar1 << 3);
    stack->items = ppvVar2;
  }
  memcpy(stack->items + stack->count,items,count << 3);
  stack->count = n;
  return;
}

Assistant:

static inline void uo_stack_push_arr(
    uo_stack *stack,
    void *const *items,
    size_t count)
{
    size_t stack_count = count + stack->count;

    if (stack_count > stack->capacity)
        stack->items = realloc(stack->items, sizeof *stack->items * (stack->capacity = next_power_of_two(stack_count)));

    memcpy(stack->items + stack->count, items, sizeof *items * count);
    stack->count = stack_count;
}